

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

void __thiscall Liby::EventLoopGroup::run(EventLoopGroup *this,BoolFunctor *bf)

{
  int local_5c;
  type local_58;
  int local_50;
  int i;
  anon_class_1_0_00000001 local_39;
  function<void_()> local_38;
  BoolFunctor *local_18;
  BoolFunctor *bf_local;
  EventLoopGroup *this_local;
  
  local_18 = bf;
  bf_local = (BoolFunctor *)this;
  std::function<void()>::function<Liby::EventLoopGroup::run(std::function<bool()>)::__0,void>
            ((function<void()> *)&local_38,&local_39);
  Signal::signal(0xd,(__sighandler_t)&local_38);
  std::function<void_()>::~function(&local_38);
  std::function<bool_()>::operator=(&this->bf_,bf);
  for (local_50 = 0; local_50 < this->n_; local_50 = local_50 + 1) {
    local_5c = local_50 + 1;
    local_58.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->threads_,&local_58,
               &local_5c);
  }
  worker_thread(this,0);
  return;
}

Assistant:

void EventLoopGroup::run(BoolFunctor bf) {
    Signal::signal(SIGPIPE, [] { error("receive SIGPIPE"); });

    bf_ = bf;
    for (int i = 0; i < n_; i++) {
        threads_.emplace_back([this](int index) { worker_thread(index); },
                              i + 1);
    }

    worker_thread(0);
}